

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,SpecType ty)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar2 = "SpecTypeAttribute";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "SpecTypeConnection";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "SpecTypeExpression";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "SpecTypeMapper";
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = "SpecTypeMapperArg";
    paVar1 = &local_d;
    break;
  case 6:
    pcVar2 = "SpecTypePrim";
    paVar1 = &local_e;
    break;
  case 7:
    pcVar2 = "SpecTypePseudoRoot";
    paVar1 = &local_f;
    break;
  case 8:
    pcVar2 = "SpecTypeRelationship";
    paVar1 = &local_10;
    break;
  case 9:
    pcVar2 = "SpecTypeRelationshipTarget";
    paVar1 = &local_11;
    break;
  case 10:
    pcVar2 = "SpecTypeVariant";
    paVar1 = &local_12;
    break;
  case 0xb:
    pcVar2 = "SpecTypeVariantSet";
    paVar1 = &local_13;
    break;
  default:
    pcVar2 = "SpecTypeInvalid";
    paVar1 = &local_14;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::SpecType ty) {
  if (SpecType::Attribute == ty) {
    return "SpecTypeAttribute";
  } else if (SpecType::Connection == ty) {
    return "SpecTypeConnection";
  } else if (SpecType::Expression == ty) {
    return "SpecTypeExpression";
  } else if (SpecType::Mapper == ty) {
    return "SpecTypeMapper";
  } else if (SpecType::MapperArg == ty) {
    return "SpecTypeMapperArg";
  } else if (SpecType::Prim == ty) {
    return "SpecTypePrim";
  } else if (SpecType::PseudoRoot == ty) {
    return "SpecTypePseudoRoot";
  } else if (SpecType::Relationship == ty) {
    return "SpecTypeRelationship";
  } else if (SpecType::RelationshipTarget == ty) {
    return "SpecTypeRelationshipTarget";
  } else if (SpecType::Variant == ty) {
    return "SpecTypeVariant";
  } else if (SpecType::VariantSet == ty) {
    return "SpecTypeVariantSet";
  }
  return "SpecTypeInvalid";
}